

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void doDecodeScan(exr_context_t f,pixels *p,int xs,int ys)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  ostream *this;
  int in_ECX;
  int in_EDX;
  undefined8 in_RDI;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  int32_t linestride;
  int32_t pixelstride;
  void *ptr;
  exr_coding_channel_info_t *curchan;
  int c;
  int32_t idxoffset;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  int y;
  exr_result_t _test_rv_2;
  exr_storage_t stortype;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  bool first;
  exr_attr_box2i_t dw;
  int32_t scansperchunk;
  exr_decode_pipeline_t decoder;
  exr_chunk_info_t cinfo;
  int32_t *in_stack_fffffffffffffcf8;
  int32_t *in_stack_fffffffffffffd00;
  uint line;
  ostream *in_stack_fffffffffffffd08;
  ostream *in_stack_fffffffffffffd10;
  exr_coding_channel_info_t *in_stack_fffffffffffffd18;
  pixels *in_stack_fffffffffffffd20;
  undefined4 local_2a8;
  int local_2a4;
  undefined8 local_2a0;
  int local_290;
  int local_27c;
  int local_274;
  int local_270;
  int local_26c;
  byte local_265;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  undefined1 local_250 [8];
  long local_248;
  short local_240;
  undefined1 local_58 [64];
  int local_18;
  int local_14;
  undefined8 local_8;
  
  local_265 = 1;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_26c = exr_get_data_window(in_RDI,0,&local_264);
  if (local_26c != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_26c);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(local_26c);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                   (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char *)in_stack_fffffffffffffcf8);
  }
  if (local_264 != local_14 * 0x11) {
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                   (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char *)in_stack_fffffffffffffcf8);
  }
  if (local_25c != local_14 * 0x56c + -1) {
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                   (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char *)in_stack_fffffffffffffcf8);
  }
  if (local_260 != local_18 * 0x1d) {
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                   (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char *)in_stack_fffffffffffffcf8);
  }
  if (local_258 != local_18 * 0xbc + -1) {
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                   (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char *)in_stack_fffffffffffffcf8);
  }
  local_270 = exr_get_scanlines_per_chunk(local_8,0,&local_254);
  if (local_270 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_270);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(local_270);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                   (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char *)in_stack_fffffffffffffcf8);
  }
  iVar1 = exr_get_storage(local_8,0,&local_274);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                   (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char *)in_stack_fffffffffffffcf8);
  }
  if (local_274 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                   (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                   (char *)in_stack_fffffffffffffcf8);
  }
  for (local_27c = local_260; local_27c <= local_258; local_27c = local_254 + local_27c) {
    iVar1 = exr_read_scanline_chunk_info(local_8,0,local_27c,local_58);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,") ");
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                     (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                     (char *)in_stack_fffffffffffffcf8);
    }
    if ((local_265 & 1) == 0) {
      iVar1 = exr_decoding_update(local_8,0,local_58,local_250);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
        in_stack_fffffffffffffd18 = (exr_coding_channel_info_t *)std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(iVar1);
        poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffd18,pcVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                       (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                       (char *)in_stack_fffffffffffffcf8);
      }
    }
    else {
      iVar1 = exr_decoding_initialize(local_8,0,local_58,local_250);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
        in_stack_fffffffffffffd20 = (pixels *)std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(iVar1);
        poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffd20,pcVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                       (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                       (char *)in_stack_fffffffffffffcf8);
      }
    }
    for (local_290 = 0; local_290 < local_240; local_290 = local_290 + 1) {
      lVar4 = local_248 + (long)local_290 * 0x30;
      if (*(int *)(lVar4 + 8) == 0) {
        *(undefined8 *)(local_248 + (long)local_290 * 0x30 + 0x28) = 0;
        *(undefined4 *)(local_248 + (long)local_290 * 0x30 + 0x20) = 0;
        *(undefined4 *)(local_248 + (long)local_290 * 0x30 + 0x24) = 0;
      }
      else {
        fill_pointers(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                      (int32_t)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                      (void **)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                      in_stack_fffffffffffffcf8);
        if (*(short *)(lVar4 + 0x1c) != local_2a4) {
          core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                         (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                         (char *)in_stack_fffffffffffffcf8);
        }
        *(undefined8 *)(local_248 + (long)local_290 * 0x30 + 0x28) = local_2a0;
        *(int *)(local_248 + (long)local_290 * 0x30 + 0x20) = local_2a4;
        *(undefined4 *)(local_248 + (long)local_290 * 0x30 + 0x24) = local_2a8;
      }
    }
    if (((local_265 & 1) != 0) &&
       (iVar1 = exr_decoding_choose_default_routines(local_8,0,local_250), iVar1 != 0)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      in_stack_fffffffffffffd10 = std::operator<<(poVar2,") ");
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      poVar2 = std::operator<<(in_stack_fffffffffffffd10,pcVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                     (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                     (char *)in_stack_fffffffffffffcf8);
    }
    iVar1 = exr_decoding_run(local_8,0,local_250);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      in_stack_fffffffffffffd08 = std::operator<<(poVar2,") ");
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      poVar2 = std::operator<<(in_stack_fffffffffffffd08,pcVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                     (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                     (char *)in_stack_fffffffffffffcf8);
    }
    local_265 = 0;
  }
  iVar1 = exr_decoding_destroy(local_8,local_250);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    this = std::operator<<(poVar2,pcVar3);
    line = (uint)((ulong)poVar2 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,line,
                   (char *)in_stack_fffffffffffffcf8);
  }
  return;
}

Assistant:

static void
doDecodeScan (exr_context_t f, pixels& p, int xs, int ys)
{
    exr_chunk_info_t      cinfo;
    exr_decode_pipeline_t decoder;
    int32_t               scansperchunk;
    exr_attr_box2i_t      dw;
    bool                  first = true;

    EXRCORE_TEST_RVAL (exr_get_data_window (f, 0, &dw));
    EXRCORE_TEST (dw.min.x == IMG_DATA_X * xs);
    EXRCORE_TEST (dw.max.x == IMG_DATA_X * xs + IMG_WIDTH * xs - 1);
    EXRCORE_TEST (dw.min.y == IMG_DATA_Y * ys);
    EXRCORE_TEST (dw.max.y == IMG_DATA_Y * ys + IMG_HEIGHT * ys - 1);

    EXRCORE_TEST_RVAL (exr_get_scanlines_per_chunk (f, 0, &scansperchunk));

    exr_storage_t stortype;
    EXRCORE_TEST_RVAL (exr_get_storage (f, 0, &stortype));
    EXRCORE_TEST (stortype == EXR_STORAGE_SCANLINE);

    //const uint8_t* tmp;
    for (int y = dw.min.y; y <= dw.max.y; y += scansperchunk)
    {
        EXRCORE_TEST_RVAL (exr_read_scanline_chunk_info (f, 0, y, &cinfo));
        if (first)
        {
            EXRCORE_TEST_RVAL (
                exr_decoding_initialize (f, 0, &cinfo, &decoder));
        }
        else
        {
            EXRCORE_TEST_RVAL (exr_decoding_update (f, 0, &cinfo, &decoder));
        }
        int32_t idxoffset = ((y - dw.min.y) / ys) * p._stride_x;

        for (int c = 0; c < decoder.channel_count; ++c)
        {
            const exr_coding_channel_info_t& curchan = decoder.channels[c];
            void*                            ptr;
            int32_t                          pixelstride;
            int32_t                          linestride;

            if (curchan.height == 0)
            {
                decoder.channels[c].decode_to_ptr     = NULL;
                decoder.channels[c].user_pixel_stride = 0;
                decoder.channels[c].user_line_stride  = 0;
                continue;
            }

            fill_pointers (
                p, curchan, idxoffset, &ptr, &pixelstride, &linestride);

            // make sure the setup has initialized our bytes for us
            EXRCORE_TEST (curchan.user_bytes_per_element == pixelstride);

            decoder.channels[c].decode_to_ptr     = (uint8_t*) ptr;
            decoder.channels[c].user_pixel_stride = pixelstride;
            decoder.channels[c].user_line_stride  = linestride;
        }

        if (first)
        {
            EXRCORE_TEST_RVAL (
                exr_decoding_choose_default_routines (f, 0, &decoder));
        }
        EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

        first = false;
    }
    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
}